

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::Framebuffer::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  VkImageSubresourceRange subresourceRange_;
  VkImageSubresourceRange subresourceRange__00;
  Parameters *pPVar1;
  VkExtent3D VVar2;
  Parameters local_1e9;
  VkImageSubresourceRange local_1e8;
  VkComponentMapping local_1d4;
  undefined8 local_1b8;
  deUint32 local_1b0;
  VkExtent3D local_1a8;
  undefined8 local_198;
  deUint32 local_190;
  Parameters local_18c;
  Parameters local_15c;
  VkImageSubresourceRange local_100;
  VkComponentMapping local_e8;
  undefined8 local_d8;
  deUint32 local_d0;
  VkExtent3D local_c8;
  undefined8 local_b8;
  deUint32 local_b0;
  Parameters local_ac;
  Parameters local_7c;
  Parameters *local_20;
  Parameters *param_2_local;
  Environment *env_local;
  Resources *this_local;
  
  local_20 = param_2;
  param_2_local = (Parameters *)env;
  env_local = (Environment *)this;
  VVar2 = ::vk::makeExtent3D(0x100,0x100,1);
  local_c8.depth = VVar2.depth;
  local_b0 = local_c8.depth;
  local_c8._0_8_ = VVar2._0_8_;
  local_b8._0_4_ = local_c8.width;
  local_b8._4_4_ = local_c8.height;
  local_d0 = local_c8.depth;
  local_d8._0_4_ = local_c8.width;
  local_d8._4_4_ = local_c8.height;
  local_c8 = VVar2;
  anon_unknown_1::Image::Parameters::Parameters
            (&local_ac,0,VK_IMAGE_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,VVar2,1,1,VK_SAMPLE_COUNT_1_BIT,
             VK_IMAGE_TILING_OPTIMAL,0x10,VK_IMAGE_LAYOUT_UNDEFINED);
  local_e8 = ::vk::makeComponentMappingRGBA();
  ::vk::makeImageSubresourceRange(&local_100,1,0,1,0,1);
  subresourceRange_.levelCount = local_100.levelCount;
  subresourceRange_.aspectMask = local_100.aspectMask;
  subresourceRange_.baseMipLevel = local_100.baseMipLevel;
  subresourceRange_.baseArrayLayer = local_100.baseArrayLayer;
  subresourceRange_.layerCount = local_100.layerCount;
  ImageView::Parameters::Parameters
            (&local_7c,&local_ac,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,local_e8,
             subresourceRange_);
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->colorAttachment,env,&local_7c);
  pPVar1 = param_2_local;
  VVar2 = ::vk::makeExtent3D(0x100,0x100,1);
  local_1a8.depth = VVar2.depth;
  local_190 = local_1a8.depth;
  local_1a8._0_8_ = VVar2._0_8_;
  local_198._0_4_ = local_1a8.width;
  local_198._4_4_ = local_1a8.height;
  local_1b0 = local_1a8.depth;
  local_1b8._0_4_ = local_1a8.width;
  local_1b8._4_4_ = local_1a8.height;
  local_1a8 = VVar2;
  anon_unknown_1::Image::Parameters::Parameters
            (&local_18c,0,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,VVar2,1,1,VK_SAMPLE_COUNT_1_BIT,
             VK_IMAGE_TILING_OPTIMAL,0x20,VK_IMAGE_LAYOUT_UNDEFINED);
  local_1d4 = ::vk::makeComponentMappingRGBA();
  ::vk::makeImageSubresourceRange(&local_1e8,2,0,1,0,1);
  subresourceRange__00.levelCount = local_1e8.levelCount;
  subresourceRange__00.aspectMask = local_1e8.aspectMask;
  subresourceRange__00.baseMipLevel = local_1e8.baseMipLevel;
  subresourceRange__00.baseArrayLayer = local_1e8.baseArrayLayer;
  subresourceRange__00.layerCount = local_1e8.layerCount;
  ImageView::Parameters::Parameters
            (&local_15c,&local_18c,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,local_1d4,
             subresourceRange__00);
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->depthStencilAttachment,(Environment *)pPVar1,&local_15c);
  pPVar1 = param_2_local;
  RenderPass::Parameters::Parameters(&local_1e9);
  Dependency<vkt::api::(anonymous_namespace)::RenderPass>::Dependency
            (&this->renderPass,(Environment *)pPVar1,&local_1e9);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: colorAttachment			(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)))
			, depthStencilAttachment	(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_D16_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_D16_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u)))
			, renderPass				(env, RenderPass::Parameters())
		{}